

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecheck.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__haystack;
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  string *this;
  long lVar4;
  allocator local_189;
  char **local_188;
  long local_180;
  string local_178;
  string local_158;
  Scale local_138;
  KeyboardMapping local_b8;
  
  local_180 = (long)argc;
  lVar4 = 1;
  local_188 = argv;
  do {
    ppcVar1 = local_188;
    if (local_180 <= lVar4) {
      return 0;
    }
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x32;
    std::operator<<((ostream *)&std::cout,local_188[lVar4]);
    __haystack = ppcVar1[lVar4];
    pcVar2 = strstr(__haystack,".scl");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(__haystack,".kbm");
      pcVar3 = " SKIPPED";
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_178,__haystack,&local_189);
        Tunings::readKBMFile(&local_b8,&local_178);
        Tunings::KeyboardMapping::~KeyboardMapping(&local_b8);
        this = &local_178;
        goto LAB_0010364f;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_158,__haystack,&local_189);
      Tunings::readSCLFile(&local_138,&local_158);
      Tunings::Scale::~Scale(&local_138);
      this = &local_158;
LAB_0010364f:
      std::__cxx11::string::~string((string *)this);
      pcVar3 = " PASSED";
    }
    std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    for (int i=1; i<argc; ++i)
    {
        std::cout << std::setw(50) << argv[i];
        try {
            if (strstr(argv[i], ".scl")) {
                Tunings::readSCLFile(argv[i]);
                std::cout << " PASSED";
            }
            else if (strstr(argv[i], ".kbm")) {
                Tunings::readKBMFile(argv[i]);
                std::cout << " PASSED";
            }
            else
            {
                std::cout << " SKIPPED";
            }

        } catch(Tunings::TuningError &t)
        {
            std::cout << " FAILED : " << t.what();
        }
        std::cout << std::endl;
    }
}